

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O1

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::Vector<double,_4U>_>::correlateFrames
          (TimeCorrFunc<OpenMD::Vector<double,_4U>_> *this,int frame1,int frame2,int timeBin)

{
  double *pdVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  pointer pVVar5;
  pointer pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  long lVar10;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar11;
  pointer *ppiVar12;
  pointer piVar13;
  pointer piVar14;
  vector<int,_std::allocator<int>_> s2;
  vector<int,_std::allocator<int>_> s1;
  vector<int,_std::allocator<int>_> local_d8;
  vector<int,_std::allocator<int>_> local_b8;
  double local_98 [5];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  if (this->doSystemProperties_ == true) {
    (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xc])
              (local_98 + 4,this,(ulong)(uint)frame1,(ulong)(uint)frame2);
    local_98[2] = (double)local_68;
    local_98[3] = (double)uStack_60;
    local_98[0] = local_98[4];
    local_98[1] = (double)uStack_70;
    pVVar5 = (this->histogram_).
             super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      pdVar1 = pVVar5[timeBin].data_ + lVar10;
      dVar9 = pdVar1[1] + local_98[lVar10 + 1];
      auVar7._8_4_ = SUB84(dVar9,0);
      auVar7._0_8_ = *pdVar1 + local_98[lVar10];
      auVar7._12_4_ = (int)((ulong)dVar9 >> 0x20);
      *(undefined1 (*) [16])(pVVar5[timeBin].data_ + lVar10) = auVar7;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 4);
    piVar2 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + timeBin;
    *piVar2 = *piVar2 + 1;
  }
  else {
    local_48 = (long)frame1 * 3;
    std::vector<int,_std::allocator<int>_>::operator=
              (&local_b8,
               (this->sele1ToIndex_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + frame1);
    lVar10 = (long)frame2;
    pvVar11 = &this->sele1ToIndex_;
    if (this->uniqueSelections_ != false) {
      pvVar11 = &this->sele2ToIndex_;
    }
    local_50 = lVar10 * 3;
    local_58 = lVar10 * 0x18;
    std::vector<int,_std::allocator<int>_>::operator=
              (&local_d8,
               (pvVar11->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar10);
    if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      local_38 = (long)timeBin;
      local_40 = local_38 << 5;
      piVar13 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar14 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      while (piVar13 !=
             local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish) {
        if (piVar14 !=
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          do {
            if (*piVar13 <= *piVar14) break;
            piVar14 = piVar14 + 1;
          } while (piVar14 !=
                   local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        if (piVar13 !=
            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          do {
            if (*piVar14 <= *piVar13) break;
            piVar13 = piVar13 + 1;
          } while (piVar13 !=
                   local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        if ((piVar14 ==
             local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish) ||
           (piVar13 ==
            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish)) break;
        if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
          pvVar6 = (this->selection1StartFrame_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppiVar12 = (pointer *)
                     ((long)&(((this->selection2StartFrame_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + local_58);
          if (this->uniqueSelections_ == false) {
            ppiVar12 = &(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + local_50;
          }
          iVar3 = *(int *)((long)(&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start)[local_48] +
                          ((long)piVar14 -
                          (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start));
          iVar4 = *(int *)((long)piVar13 +
                          ((long)*ppiVar12 -
                          (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start));
          if (iVar3 != iVar4) break;
          (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x13])
                    (local_98 + 4,this,(ulong)(uint)frame1,(ulong)(uint)frame2,
                     (ulong)((long)piVar14 -
                            (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2,
                     (ulong)((long)piVar13 -
                            (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
          local_98[2] = (double)local_68;
          local_98[3] = (double)uStack_60;
          local_98[0] = local_98[4];
          local_98[1] = (double)uStack_70;
          if (iVar3 != iVar4) break;
        }
        else {
          (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x13])
                    (local_98 + 4,this,(ulong)(uint)frame1,(ulong)(uint)frame2,
                     (ulong)((long)piVar14 -
                            (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2,
                     (ulong)((long)piVar13 -
                            (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
          local_98[2] = (double)local_68;
          local_98[3] = (double)uStack_60;
          local_98[0] = local_98[4];
          local_98[1] = (double)uStack_70;
        }
        pVVar5 = (this->histogram_).
                 super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = 0;
        do {
          pdVar1 = (double *)((long)pVVar5->data_ + lVar10 * 8 + local_40);
          dVar9 = pdVar1[1] + local_98[lVar10 + 1];
          auVar8._8_4_ = SUB84(dVar9,0);
          auVar8._0_8_ = *pdVar1 + local_98[lVar10];
          auVar8._12_4_ = (int)((ulong)dVar9 >> 0x20);
          *(undefined1 (*) [16])((long)pVVar5->data_ + lVar10 * 8 + local_40) = auVar8;
          lVar10 = lVar10 + 2;
        } while (lVar10 != 4);
        piVar2 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + local_38;
        *piVar2 = *piVar2 + 1;
        piVar14 = piVar14 + 1;
        piVar13 = piVar13 + 1;
        local_98[0] = local_98[4];
        local_98[1] = (double)uStack_70;
        local_98[2] = (double)local_68;
        local_98[3] = (double)uStack_60;
        if (piVar14 ==
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) break;
      }
    }
  }
  if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::correlateFrames(int frame1, int frame2, int timeBin) {
    std::vector<int> s1;
    std::vector<int> s2;

    std::vector<int>::iterator i1;
    std::vector<int>::iterator i2;

    T corrVal(0.0);
    T zeroType(0.0);

    if (doSystemProperties_) {
      corrVal = calcCorrVal(frame1, frame2);
      histogram_[timeBin] += corrVal;
      count_[timeBin]++;

    } else {
      s1 = sele1ToIndex_[frame1];

      if (uniqueSelections_)
        s2 = sele2ToIndex_[frame2];
      else
        s2 = sele1ToIndex_[frame2];

      for (i1 = s1.begin(), i2 = s2.begin(); i1 != s1.end() && i2 != s2.end();
           ++i1, ++i2) {
        // If the selections are dynamic, they might not have the
        // same objects in both frames, so we need to roll either of
        // the selections until we have the same object to
        // correlate.

        while (i1 != s1.end() && *i1 < *i2) {
          ++i1;
        }

        while (i2 != s2.end() && *i2 < *i1) {
          ++i2;
        }

        if (i1 == s1.end() || i2 == s2.end()) break;

	if (selectionModeRestart_) {
	  
	  int ssf1 = selection1StartFrame_[frame1][i1 - s1.begin()];
	  int ssf2 = uniqueSelections_ ?
	    selection2StartFrame_[frame2][i2 - s2.begin()] :
	    selection1StartFrame_[frame2][i2 - s2.begin()];


	  if (ssf1 != ssf2) break;
	  corrVal = calcCorrVal(frame1, frame2,
				i1 - s1.begin(), i2 - s2.begin());	  
	} else {
	  
	  corrVal = calcCorrVal(frame1, frame2,
				i1 - s1.begin(), i2 - s2.begin());        
	}
        histogram_[timeBin] += corrVal;
        count_[timeBin]++;
      }
    }
  }